

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O1

void __thiscall GraphTestImplicitOutputOnlyParse::Run(GraphTestImplicitOutputOnlyParse *this)

{
  Edge *pEVar1;
  Test *pTVar2;
  int iVar3;
  Node *pNVar4;
  string local_50;
  
  iVar3 = g_current_test->assertion_failures_;
  AssertParse(&(this->super_GraphTest).super_StateTestWithBuiltinRules.state_,
              "build | out.imp: cat in\n",(ManifestParserOptions)0x0);
  if (iVar3 == g_current_test->assertion_failures_) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"out.imp","");
    pNVar4 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_50);
    pEVar1 = pNVar4->in_edge_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    testing::Test::Check
              (g_current_test,
               (long)(pEVar1->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pEVar1->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_start == 8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
               ,0x99,"1 == edge->outputs_.size()");
    pTVar2 = g_current_test;
    iVar3 = std::__cxx11::string::compare
                      ((char *)*(pEVar1->outputs_).
                                super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                super__Vector_impl_data._M_start);
    testing::Test::Check
              (pTVar2,iVar3 == 0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
               ,0x9a,"\"out.imp\" == edge->outputs_[0]->path()");
    testing::Test::Check
              (g_current_test,pEVar1->implicit_outs_ == 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
               ,0x9b,"1 == edge->implicit_outs_");
    pTVar2 = g_current_test;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"out.imp","");
    pNVar4 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_50);
    testing::Test::Check
              (pTVar2,pEVar1 == pNVar4->in_edge_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
               ,0x9c,"edge == GetNode(\"out.imp\")->in_edge()");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(GraphTest, ImplicitOutputOnlyParse) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build | out.imp: cat in\n"));

  Edge* edge = GetNode("out.imp")->in_edge();
  EXPECT_EQ(1, edge->outputs_.size());
  EXPECT_EQ("out.imp", edge->outputs_[0]->path());
  EXPECT_EQ(1, edge->implicit_outs_);
  EXPECT_EQ(edge, GetNode("out.imp")->in_edge());
}